

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ghosts.c
# Opt level: O2

void get_remote_block_neg
               (Integer idx,Integer ndim,Integer *lo_loc,Integer *hi_loc,Integer *slo_rem,
               Integer *shi_rem,Integer *dims,Integer *width)

{
  Integer IVar1;
  long lVar2;
  Integer IVar3;
  Integer aIStack_88 [2];
  Integer hi_rem [7];
  Integer lo_rem [7];
  
  lVar2 = 0;
  if (ndim < 1) {
    ndim = lVar2;
  }
  for (; ndim != lVar2; lVar2 = lVar2 + 1) {
    if (idx == lVar2) {
      IVar3 = lo_loc[idx] - width[idx];
      IVar1 = lo_loc[idx] + -1;
    }
    else {
      IVar3 = lo_loc[lVar2];
      IVar1 = hi_loc[lVar2];
    }
    hi_rem[lVar2 + 6] = IVar3;
    aIStack_88[lVar2] = IVar1;
  }
  for (lVar2 = 0; ndim != lVar2; lVar2 = lVar2 + 1) {
    if (idx == lVar2) {
      if (hi_rem[idx + 6] < 1) {
        slo_rem[idx] = (dims[idx] - width[idx]) + 1;
        IVar3 = dims[idx];
      }
      else {
        slo_rem[idx] = hi_rem[idx + 6];
        IVar3 = aIStack_88[idx];
      }
      shi_rem[idx] = IVar3;
    }
    else {
      slo_rem[lVar2] = hi_rem[lVar2 + 6];
      shi_rem[lVar2] = aIStack_88[lVar2];
    }
  }
  return;
}

Assistant:

static void get_remote_block_neg(Integer idx, Integer ndim, Integer *lo_loc,
                          Integer *hi_loc, Integer *slo_rem, Integer *shi_rem,
                          Integer *dims, Integer *width)
{
  Integer i, lo_rem[MAXDIM], hi_rem[MAXDIM];
  /*Start by getting rough idea of where data needs to go. */
  for (i = 0; i < ndim; i++) {
    if (i == idx) {
      lo_rem[i] = lo_loc[i] - width[i];
      hi_rem[i] = lo_loc[i] - 1;
    } else {
      lo_rem[i] = lo_loc[i];
      hi_rem[i] = hi_loc[i];
    }
  }

  /* Account for boundaries, if necessary. */
  for (i=0; i<ndim; i++) {
    if (i == idx) {
      if (lo_rem[i] < 1) {
        slo_rem[i] = dims[i] - width[i] + 1;
        shi_rem[i] = dims[i];
      } else {
        slo_rem[i] = lo_rem[i];
        shi_rem[i] = hi_rem[i];
      }
    } else {
      slo_rem[i] = lo_rem[i];
      shi_rem[i] = hi_rem[i];
    }
  }
}